

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O3

string * gguf_data_to_str_abi_cxx11_(string *__return_storage_ptr__,gguf_type type,void *data,int i)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *extraout_RAX;
  string *psVar8;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  uint uVar9;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  string *__str;
  char *pcVar12;
  uint uVar13;
  uint __len;
  uint uVar14;
  ulong __val;
  pointer pcVar15;
  double dVar16;
  
  switch((ulong)type) {
  case 0:
    bVar1 = *(byte *)((long)data + (long)i);
    uVar13 = (uint)bVar1;
    __len = 1;
    if (9 < bVar1) {
      __len = 3 - (bVar1 < 100);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p;
    break;
  case 1:
    uVar14 = (uint)*(char *)((long)data + (long)i);
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    __len = 1;
    if (9 < uVar13) {
      __len = 3 - (uVar13 < 100);
    }
    goto LAB_001afb4d;
  case 2:
    uVar2 = *(ushort *)((long)data + (long)i * 2);
    uVar13 = (uint)uVar2;
    __len = 1;
    if (((9 < uVar13) && (__len = 2, 99 < uVar2)) && (__len = 3, 999 < uVar13)) {
      __len = 5 - (uVar13 < 10000);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p;
    break;
  case 3:
    uVar14 = (uint)*(short *)((long)data + (long)i * 2);
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    __len = 1;
    if (((9 < uVar13) && (__len = 2, 99 < uVar13)) && (__len = 3, 999 < uVar13)) {
      __len = 5 - (uVar13 < 10000);
    }
LAB_001afb4d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar14 >> 0x1f));
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p + (uVar14 >> 0x1f);
    break;
  case 4:
    uVar13 = *(uint *)((long)data + (long)i * 4);
    cVar6 = '\x01';
    if (9 < uVar13) {
      uVar14 = uVar13;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar14 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001afcf8;
        }
        if (uVar14 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001afcf8;
        }
        if (uVar14 < 10000) goto LAB_001afcf8;
        bVar3 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_001afcf8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar6);
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __len = (uint)__return_storage_ptr__->_M_string_length;
    break;
  case 5:
    uVar14 = *(uint *)((long)data + (long)i * 4);
    uVar13 = -uVar14;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    __len = 1;
    if (9 < uVar13) {
      uVar11 = (ulong)uVar13;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar9 = (uint)uVar11;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_001afd16;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_001afd16;
        }
        if (uVar9 < 10000) goto LAB_001afd16;
        uVar11 = uVar11 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_001afd16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar14 >> 0x1f));
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p + (uVar14 >> 0x1f);
    break;
  case 6:
    dVar16 = (double)*(float *)((long)data + (long)i * 4);
    __n = 0x3a;
    goto LAB_001afb92;
  case 7:
    bVar1 = *(byte *)((long)data + (long)i);
    pcVar12 = "false";
    if ((ulong)bVar1 != 0) {
      pcVar12 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar12,pcVar12 + ((ulong)bVar1 ^ 5));
    return extraout_RAX;
  default:
    psVar8 = format_abi_cxx11_(__return_storage_ptr__,"unknown type %d",(ulong)type);
    return psVar8;
  case 10:
    __val = *(ulong *)((long)data + (long)i * 8);
    cVar6 = '\x01';
    if (9 < __val) {
      uVar11 = __val;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar11 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001afd78;
        }
        if (uVar11 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001afd78;
        }
        if (uVar11 < 10000) goto LAB_001afd78;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_001afd78:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar6);
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar13 = (uint)__return_storage_ptr__->_M_string_length;
    goto LAB_001afd91;
  case 0xb:
    uVar11 = *(ulong *)((long)data + (long)i * 8);
    __val = -uVar11;
    if (0 < (long)uVar11) {
      __val = uVar11;
    }
    uVar13 = 1;
    if (9 < __val) {
      uVar10 = __val;
      uVar14 = 4;
      do {
        uVar13 = uVar14;
        if (uVar10 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001afd4f;
        }
        if (uVar10 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001afd4f;
        }
        if (uVar10 < 10000) goto LAB_001afd4f;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar14 = uVar13 + 4;
      } while (bVar3);
      uVar13 = uVar13 + 1;
    }
LAB_001afd4f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar13 - (char)((long)uVar11 >> 0x3f));
    pcVar15 = (__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar11 >> 0x3f);
LAB_001afd91:
    std::__detail::__to_chars_10_impl<unsigned_long>(pcVar15,uVar13,__val);
    return extraout_RAX_01;
  case 0xc:
    dVar16 = *(double *)((long)data + (long)i * 8);
    __n = 0x148;
LAB_001afb92:
    pbVar7 = __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                       (__return_storage_ptr__,vsnprintf,__n,"%f",dVar16);
    return pbVar7;
  }
  std::__detail::__to_chars_10_impl<unsigned_int>(pcVar15,__len,uVar13);
  return extraout_RAX_00;
}

Assistant:

static std::string gguf_data_to_str(enum gguf_type type, const void * data, int i) {
    switch (type) {
        case GGUF_TYPE_UINT8:   return std::to_string(((const uint8_t  *)data)[i]);
        case GGUF_TYPE_INT8:    return std::to_string(((const int8_t   *)data)[i]);
        case GGUF_TYPE_UINT16:  return std::to_string(((const uint16_t *)data)[i]);
        case GGUF_TYPE_INT16:   return std::to_string(((const int16_t  *)data)[i]);
        case GGUF_TYPE_UINT32:  return std::to_string(((const uint32_t *)data)[i]);
        case GGUF_TYPE_INT32:   return std::to_string(((const int32_t  *)data)[i]);
        case GGUF_TYPE_UINT64:  return std::to_string(((const uint64_t *)data)[i]);
        case GGUF_TYPE_INT64:   return std::to_string(((const int64_t  *)data)[i]);
        case GGUF_TYPE_FLOAT32: return std::to_string(((const float    *)data)[i]);
        case GGUF_TYPE_FLOAT64: return std::to_string(((const double   *)data)[i]);
        case GGUF_TYPE_BOOL:    return ((const bool *)data)[i] ? "true" : "false";
        default:                return format("unknown type %d", type);
    }
}